

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_lookup_name_(char *service_name,MPIABI_Fint *info,char *port_name,MPIABI_Fint *ierror,
                        size_t service_name_len,size_t port_name_len)

{
  size_t port_name_len_local;
  size_t service_name_len_local;
  MPIABI_Fint *ierror_local;
  char *port_name_local;
  MPIABI_Fint *info_local;
  char *service_name_local;
  
  mpi_lookup_name_(service_name,info,port_name,ierror,service_name_len,port_name_len);
  return;
}

Assistant:

void mpiabi_lookup_name_(
  const char * service_name,
  const MPIABI_Fint * info,
  char * port_name,
  MPIABI_Fint * ierror,
  size_t service_name_len,
  size_t port_name_len
) {
  return mpi_lookup_name_(
    service_name,
    info,
    port_name,
    ierror,
    service_name_len,
    port_name_len
  );
}